

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O0

Matrix33d * gmath::createRx(double a)

{
  double *pdVar1;
  SMatrix<double,_3,_3> *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  Matrix33d *ret;
  
  SMatrix<double,_3,_3>::SMatrix(in_RDI);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,0,0);
  *pdVar1 = 1.0;
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,0,1);
  *pdVar1 = 0.0;
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,0,2);
  *pdVar1 = 0.0;
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,1,0);
  *pdVar1 = 0.0;
  dVar2 = cos(in_XMM0_Qa);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,1,1);
  *pdVar1 = dVar2;
  dVar2 = sin(in_XMM0_Qa);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,1,2);
  *pdVar1 = -dVar2;
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,2,0);
  *pdVar1 = 0.0;
  dVar2 = sin(in_XMM0_Qa);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,2,1);
  *pdVar1 = dVar2;
  dVar2 = cos(in_XMM0_Qa);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,2,2);
  *pdVar1 = dVar2;
  return in_RDI;
}

Assistant:

Matrix33d createRx(double a)
{
  Matrix33d ret;

  ret(0, 0)=1.0;
  ret(0, 1)=0.0;
  ret(0, 2)=0.0;

  ret(1, 0)=0.0;
  ret(1, 1)=cos(a);
  ret(1, 2)=-sin(a);

  ret(2, 0)=0.0;
  ret(2, 1)=sin(a);
  ret(2, 2)=cos(a);

  return ret;
}